

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::save_load(gd *g,io_buf *model_file,bool read,bool text)

{
  sparse_parameters *this;
  float fVar1;
  float fVar2;
  vw *all;
  _func_void_weight_ptr_void_ptr *p_Var3;
  char cVar4;
  uint32_t uVar5;
  bool bVar6;
  pair<float,_float> *ppVar7;
  ulong uVar8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var9;
  float *pfVar10;
  ostream *poVar11;
  long *plVar12;
  uint32_t *puVar13;
  undefined7 in_register_00000011;
  uint64_t index;
  stringstream msg;
  ulong local_1c8;
  float local_1bc;
  ulong local_1b8;
  float *local_1b0;
  undefined1 local_1a8 [376];
  
  all = g->all;
  if ((int)CONCAT71(in_register_00000011,read) != 0) {
    initialize_regressor(all);
    if ((all->adaptive == true) && (fVar1 = all->initial_t, 0.0 < fVar1)) {
      fVar2 = all->initial_weight;
      if ((all->weights).sparse == true) {
        local_1bc = fVar2;
        ppVar7 = calloc_or_throw<std::pair<float,float>>(1);
        ppVar7->first = local_1bc;
        ppVar7->second = fVar1;
        (all->weights).sparse_weights.default_data = ppVar7;
        (all->weights).sparse_weights.fun = set_initial_gd_wrapper<sparse_parameters>::func;
        pfVar10 = (all->weights).sparse_weights.default_value;
        *pfVar10 = ppVar7->first;
        pfVar10[1] = ppVar7->second;
      }
      else {
        pfVar10 = (all->weights).dense_weights._begin;
        if (pfVar10 != pfVar10 + (all->weights).dense_weights._weight_mask + 1) {
          uVar5 = (all->weights).dense_weights._stride_shift;
          do {
            *pfVar10 = fVar2;
            pfVar10[1] = fVar1;
            pfVar10 = pfVar10 + (1L << ((byte)uVar5 & 0x3f));
          } while (pfVar10 !=
                   (all->weights).dense_weights._begin +
                   (all->weights).dense_weights._weight_mask + 1);
        }
      }
    }
    fVar1 = g->initial_constant;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      bVar6 = (all->weights).sparse;
      puVar13 = &(all->weights).dense_weights._stride_shift;
      if (bVar6 != false) {
        puVar13 = &(all->weights).sparse_weights._stride_shift;
      }
      uVar8 = 0xb1c55cL << ((byte)*puVar13 & 0x3f);
      if (bVar6 == true) {
        this = &(all->weights).sparse_weights;
        local_1c8 = uVar8 & (all->weights).sparse_weights._weight_mask;
        _Var9._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)this,&local_1c8);
        if (_Var9._M_cur == (__node_type *)0x0) {
          local_1b0 = calloc_or_throw<float>
                                (1L << ((byte)(all->weights).sparse_weights._stride_shift & 0x3f));
          local_1b8 = local_1c8;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this);
          _Var9._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)this,&local_1c8);
          p_Var3 = (all->weights).sparse_weights.fun;
          if (p_Var3 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var3)(*(weight **)((long)_Var9._M_cur + 0x10),
                      (all->weights).sparse_weights.default_data);
          }
        }
        pfVar10 = *(float **)
                   ((long)&((_Var9._M_cur)->
                           super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                           _M_storage._M_storage + 8);
      }
      else {
        pfVar10 = (all->weights).dense_weights._begin +
                  (uVar8 & (all->weights).dense_weights._weight_mask);
      }
      *pfVar10 = fVar1;
    }
  }
  if ((model_file->files)._end == (model_file->files)._begin) goto LAB_00150ab8;
  local_1c8 = CONCAT71(local_1c8._1_7_,all->save_resume);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
  poVar11 = std::ostream::_M_insert<bool>(SUB81((ostream *)local_1a8,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  if (read) {
    io_buf::bin_read_fixed(model_file,(char *)&local_1c8,1,"");
    if ((char)local_1c8 != '\0') {
      bVar6 = version_struct::operator<(&all->model_file_ver,"7.10.1");
      if (bVar6) {
        cVar4 = (char)all + -0x20;
        std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar4);
        std::ostream::put(cVar4);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,
                   "WARNING: --save_resume functionality is known to have inaccuracy in model files version less than "
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"7.10.1",6);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        plVar12 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
        std::ostream::put((char)plVar12);
        std::ostream::flush();
      }
      goto LAB_00150a6d;
    }
LAB_00150a86:
    save_load_regressor(all,model_file,read,text);
  }
  else {
    bin_text_write_fixed(model_file,(char *)&local_1c8,1,(stringstream *)&local_1b8,text);
    if ((char)local_1c8 == '\0') goto LAB_00150a86;
LAB_00150a6d:
    save_load_online_state(all,model_file,read,text,g);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
LAB_00150ab8:
  if (all->training == false) {
    sync_weights(all);
  }
  return;
}

Assistant:

void save_load(gd& g, io_buf& model_file, bool read, bool text)
{
  vw& all = *g.all;
  if (read)
  {
    initialize_regressor(all);

    if (all.adaptive && all.initial_t > 0)
    {
      float init_weight = all.initial_weight;
      pair<float, float> p = make_pair(init_weight, all.initial_t);
      if (all.weights.sparse)
        all.weights.sparse_weights.set_default<pair<float, float>, set_initial_gd_wrapper<sparse_parameters> >(p);
      else
        all.weights.dense_weights.set_default<pair<float, float>, set_initial_gd_wrapper<dense_parameters> >(p);
      // for adaptive update, we interpret initial_t as previously seeing initial_t fake datapoints, all with squared
      // gradient=1 NOTE: this is not invariant to the scaling of the data (i.e. when combined with normalized). Since
      // scaling the data scales the gradient, this should ideally be feature_range*initial_t, or something like that.
      // We could potentially fix this by just adding this base quantity times the current range to the sum of gradients
      // stored in memory at each update, and always start sum of gradients to 0, at the price of additional additions
      // and multiplications during the update...
    }
    if (g.initial_constant != 0.0)
      VW::set_weight(all, constant, 0, g.initial_constant);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = all.save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);
    if (resume)
    {
      if (read && all.model_file_ver < VERSION_SAVE_RESUME_FIX)
        all.trace_message
            << endl
            << "WARNING: --save_resume functionality is known to have inaccuracy in model files version less than "
            << VERSION_SAVE_RESUME_FIX << endl
            << endl;
      // save_load_online_state(g, model_file, read, text);
      save_load_online_state(all, model_file, read, text, &g);
    }
    else
      save_load_regressor(all, model_file, read, text);
  }
  if (!all.training)  // If the regressor was saved as --save_resume, then when testing we want to materialize the
                      // weights.
    sync_weights(all);
}